

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_uid_uname.c
# Opt level: O2

void test_option_uid_uname(void)

{
  wchar_t wVar1;
  char *pcVar2;
  char *pcVar3;
  size_t s;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
                  ,L'!',L'\0');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
                      ,L'\"',"file",L'Ƥ',L'\xffffffff',"1234567890");
  failure("Error invoking %s c",testprog);
  wVar1 = systemf("%s cf archive1 --format=ustar file >stdout1.txt 2>stderr1.txt",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
                      ,L'(',0,"0",(long)wVar1,
                      "systemf(\"%s cf archive1 --format=ustar file >stdout1.txt 2>stderr1.txt\", testprog)"
                      ,(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
             ,L')',"stdout1.txt");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
             ,L'*',"stderr1.txt");
  pcVar2 = slurpfile(&s,"archive1");
  failure("Error invoking %s c",testprog);
  wVar1 = systemf("%s cf archive2 --uid=17 --uname=foofoofoo --format=ustar file >stdout2.txt 2>stderr2.txt"
                  ,testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
                      ,L'1',0,"0",(long)wVar1,
                      "systemf(\"%s cf archive2 --uid=17 --uname=foofoofoo --format=ustar file >stdout2.txt 2>stderr2.txt\", testprog)"
                      ,(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
             ,L'2',"stdout2.txt");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
             ,L'3',"stderr2.txt");
  pcVar3 = slurpfile(&s,"archive2");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
                      ,L'6',pcVar3 + 0x6c,"data + 108","000021 ","\"000021 \\0\"",8,"8",(void *)0x0)
  ;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
                      ,L'7',pcVar3 + 0x109,"data + 265","foofoofoo","\"foofoofoo\\0\"",10,"10",
                      (void *)0x0);
  failure("Error invoking %s c",testprog);
  wVar1 = systemf("%s cf archive3 --uid=17 --format=ustar file >stdout3.txt 2>stderr3.txt",testprog)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
                      ,L'=',0,"0",(long)wVar1,
                      "systemf(\"%s cf archive3 --uid=17 --format=ustar file >stdout3.txt 2>stderr3.txt\", testprog)"
                      ,(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
             ,L'>',"stdout3.txt");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
             ,L'?',"stderr3.txt");
  pcVar3 = slurpfile(&s,"archive3");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
                      ,L'A',pcVar3 + 0x6c,"data + 108","000021 ","\"000021 \\0\"",8,"8",(void *)0x0)
  ;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
                      ,L'C',pcVar3 + 0x109,"data + 265","","\"\\0\"",1,"1",(void *)0x0);
  failure("Error invoking %s c",testprog);
  wVar1 = systemf("%s cf archive4 --uname=foofoofoo --format=ustar file >stdout4.txt 2>stderr4.txt",
                  testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
                      ,L'I',0,"0",(long)wVar1,
                      "systemf(\"%s cf archive4 --uname=foofoofoo --format=ustar file >stdout4.txt 2>stderr4.txt\", testprog)"
                      ,(void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
             ,L'J',"stdout4.txt");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
             ,L'K',"stderr4.txt");
  pcVar3 = slurpfile(&s,"archive4");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
                      ,L'N',pcVar3 + 0x6c,"data + 108",pcVar2 + 0x6c,"reference + 108",8,"8",
                      (void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_uid_uname.c"
                      ,L'O',pcVar3 + 0x109,"data + 265","foofoofoo","\"foofoofoo\\0\"",10,"10",
                      (void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_option_uid_uname)
{
	char *reference, *data;
	size_t s;

	assertUmask(0);
	assertMakeFile("file", 0644, "1234567890");

	/* Create archive with no special options. */
	failure("Error invoking %s c", testprog);
	assertEqualInt(0,
	    systemf("%s cf archive1 --format=ustar file >stdout1.txt 2>stderr1.txt",
		testprog));
	assertEmptyFile("stdout1.txt");
	assertEmptyFile("stderr1.txt");
	reference = slurpfile(&s, "archive1");

	/* Again with both --uid and --uname */
	failure("Error invoking %s c", testprog);
	assertEqualInt(0,
	    systemf("%s cf archive2 --uid=17 --uname=foofoofoo --format=ustar file >stdout2.txt 2>stderr2.txt",
		testprog));
	assertEmptyFile("stdout2.txt");
	assertEmptyFile("stderr2.txt");
	data = slurpfile(&s, "archive2");
	/* Should force uid and uname fields in ustar header. */
	assertEqualMem(data + 108, "000021 \0", 8);
	assertEqualMem(data + 265, "foofoofoo\0", 10);

	/* Again with just --uid */
	failure("Error invoking %s c", testprog);
	assertEqualInt(0,
	    systemf("%s cf archive3 --uid=17 --format=ustar file >stdout3.txt 2>stderr3.txt",
		testprog));
	assertEmptyFile("stdout3.txt");
	assertEmptyFile("stderr3.txt");
	data = slurpfile(&s, "archive3");
	assertEqualMem(data + 108, "000021 \0", 8);
	/* Uname field in ustar header should be empty. */
	assertEqualMem(data + 265, "\0", 1);

	/* Again with just --uname */
	failure("Error invoking %s c", testprog);
	assertEqualInt(0,
	    systemf("%s cf archive4 --uname=foofoofoo --format=ustar file >stdout4.txt 2>stderr4.txt",
		testprog));
	assertEmptyFile("stdout4.txt");
	assertEmptyFile("stderr4.txt");
	data = slurpfile(&s, "archive4");
	/* Uid should be unchanged from original reference. */
	assertEqualMem(data + 108, reference + 108, 8);
	assertEqualMem(data + 265, "foofoofoo\0", 10);
}